

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O1

void google::protobuf::TestUtil::ReflectionTester::ExpectOneofSetViaReflection(Message *message)

{
  bool bVar1;
  Descriptor *this;
  FieldDescriptor *pFVar2;
  Message *this_00;
  string *psVar3;
  Reflection *this_01;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  Metadata MVar5;
  Metadata MVar6;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string scratch;
  AssertHelper local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  AssertHelper local_58;
  string local_50;
  
  MVar5 = Message::GetMetadata(message);
  this = MVar5.descriptor;
  MVar5 = Message::GetMetadata(message);
  this_01 = MVar5.reflection;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  name._M_str = "foo_lazy_message";
  name._M_len = 0x10;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pFVar2 = Descriptor::FindFieldByName(this,name);
  bVar1 = Reflection::HasField(this_01,message,pFVar2);
  local_88._M_head_impl._0_1_ = (internal)bVar1;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&local_88,
               (AssertionResult *)
               "reflection->HasField( message, descriptor->FindFieldByName(\"foo_lazy_message\"))",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x16b,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_90.data_._4_4_,(int32_t)local_90.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(int32_t)local_90.data_) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  name_00._M_str = "bar_cord";
  name_00._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this,name_00);
  bVar1 = Reflection::HasField(this_01,message,pFVar2);
  local_88._M_head_impl._0_1_ = (internal)bVar1;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&local_88,
               (AssertionResult *)
               "reflection->HasField(message, descriptor->FindFieldByName(\"bar_cord\"))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x16d,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_90.data_._4_4_,(int32_t)local_90.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(int32_t)local_90.data_) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  name_01._M_str = "baz_int";
  name_01._M_len = 7;
  pFVar2 = Descriptor::FindFieldByName(this,name_01);
  bVar1 = Reflection::HasField(this_01,message,pFVar2);
  local_88._M_head_impl._0_1_ = (internal)bVar1;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&local_88,
               (AssertionResult *)
               "reflection->HasField(message, descriptor->FindFieldByName(\"baz_int\"))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x16f,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_90.data_._4_4_,(int32_t)local_90.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(int32_t)local_90.data_) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  name_02._M_str = "baz_string";
  name_02._M_len = 10;
  pFVar2 = Descriptor::FindFieldByName(this,name_02);
  bVar1 = Reflection::HasField(this_01,message,pFVar2);
  local_88._M_head_impl._0_1_ = (internal)bVar1;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)&local_88,
               (AssertionResult *)
               "reflection->HasField(message, descriptor->FindFieldByName(\"baz_string\"))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x171,(char *)CONCAT71(local_78._1_7_,local_78[0]));
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_90.data_._4_4_,(int32_t)local_90.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(int32_t)local_90.data_) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  name_03._M_str = "foo_lazy_message";
  name_03._M_len = 0x10;
  pFVar2 = Descriptor::FindFieldByName(this,name_03);
  this_00 = Reflection::GetMessage(this_01,message,pFVar2,(MessageFactory *)0x0);
  local_90.data_._0_4_ = 100;
  MVar5 = Message::GetMetadata(this_00);
  MVar6 = Message::GetMetadata(this_00);
  name_04._M_str = "moo_int";
  name_04._M_len = 7;
  pFVar2 = Descriptor::FindFieldByName(MVar6.descriptor,name_04);
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Reflection::GetInt64(MVar5.reflection,this_00,pFVar2);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_78,"100",
             "sub_message->GetReflection()->GetInt64( *sub_message, sub_message->GetDescriptor()->FindFieldByName(\"moo_int\"))"
             ,(int *)&local_90,(long *)&local_88);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x177,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  name_05._M_str = "bar_cord";
  name_05._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this,name_05);
  Reflection::GetString_abi_cxx11_((string *)local_78,this_01,message,pFVar2);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_88,"\"101\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"bar_cord\"))",
             (char (*) [4])0x119275d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
  }
  if (local_88._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x17a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT71(local_78._1_7_,local_78[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_78._1_7_,local_78[0]) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  name_06._M_str = "bar_cord";
  name_06._M_len = 8;
  pFVar2 = Descriptor::FindFieldByName(this,name_06);
  psVar3 = Reflection::GetStringReference(this_01,message,pFVar2,&local_50);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_78,"\"101\"",
             "reflection->GetStringReference( message, descriptor->FindFieldByName(\"bar_cord\"), &scratch)"
             ,(char (*) [4])0x119275d,psVar3);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x17d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_88._M_head_impl._0_4_ = 0x66;
  name_07._M_str = "baz_int";
  name_07._M_len = 7;
  pFVar2 = Descriptor::FindFieldByName(this,name_07);
  local_90.data_._0_4_ = Reflection::GetInt32(this_01,message,pFVar2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_78,"102",
             "reflection->GetInt32(message, descriptor->FindFieldByName(\"baz_int\"))",
             (int *)&local_88,(int *)&local_90);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x180,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  name_08._M_str = "baz_string";
  name_08._M_len = 10;
  pFVar2 = Descriptor::FindFieldByName(this,name_08);
  Reflection::GetString_abi_cxx11_((string *)local_78,this_01,message,pFVar2);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_88,"\"103\"",
             "reflection->GetString( message, descriptor->FindFieldByName(\"baz_string\"))",
             (char (*) [4])"103",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_78._1_7_,local_78[0]) != &local_68) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_78._1_7_,local_78[0]),local_68._M_allocated_capacity + 1);
  }
  if (local_88._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x183,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT71(local_78._1_7_,local_78[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_78._1_7_,local_78[0]) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  name_09._M_str = "baz_string";
  name_09._M_len = 10;
  pFVar2 = Descriptor::FindFieldByName(this,name_09);
  psVar3 = Reflection::GetStringReference(this_01,message,pFVar2,&local_50);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)local_78,"\"103\"",
             "reflection->GetStringReference( message, descriptor->FindFieldByName(\"baz_string\"), &scratch)"
             ,(char (*) [4])"103",psVar3);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x186,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::ExpectOneofSetViaReflection(
    const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();
  std::string scratch;
  EXPECT_TRUE(reflection->HasField(
      message, descriptor->FindFieldByName("foo_lazy_message")));
  EXPECT_TRUE(
      reflection->HasField(message, descriptor->FindFieldByName("bar_cord")));
  EXPECT_TRUE(
      reflection->HasField(message, descriptor->FindFieldByName("baz_int")));
  EXPECT_TRUE(
      reflection->HasField(message, descriptor->FindFieldByName("baz_string")));

  const Message* sub_message = &reflection->GetMessage(
      message, descriptor->FindFieldByName("foo_lazy_message"));
  EXPECT_EQ(100, sub_message->GetReflection()->GetInt64(
                     *sub_message,
                     sub_message->GetDescriptor()->FindFieldByName("moo_int")));

  EXPECT_EQ("101", reflection->GetString(
                       message, descriptor->FindFieldByName("bar_cord")));
  EXPECT_EQ("101",
            reflection->GetStringReference(
                message, descriptor->FindFieldByName("bar_cord"), &scratch));

  EXPECT_EQ(102, reflection->GetInt32(message,
                                      descriptor->FindFieldByName("baz_int")));

  EXPECT_EQ("103", reflection->GetString(
                       message, descriptor->FindFieldByName("baz_string")));
  EXPECT_EQ("103",
            reflection->GetStringReference(
                message, descriptor->FindFieldByName("baz_string"), &scratch));
}